

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
hta::detail::
make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_long,_const_char_*,_unsigned_long>
::operator()(make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_long,_const_char_*,_unsigned_long>
             *this,stringstream *msg,char *arg,path *args,char *args_1,long args_2,char *args_3,
            unsigned_long args_4)

{
  char *msg_00;
  path local_68;
  make_exception<std::filesystem::__cxx11::path,_const_char_*,_long,_const_char_*,_unsigned_long>
  local_39;
  long local_38;
  long args_local_2;
  char *args_local_1;
  path *args_local;
  char *arg_local;
  stringstream *msg_local;
  make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_long,_const_char_*,_unsigned_long>
  *this_local;
  
  local_38 = args_2;
  args_local_2 = (long)args_1;
  args_local_1 = (char *)args;
  args_local = (path *)arg;
  arg_local = (char *)msg;
  msg_local = (stringstream *)this;
  std::operator<<((ostream *)(msg + 0x10),arg);
  msg_00 = arg_local;
  Catch::clara::std::filesystem::__cxx11::path::path(&local_68,(path *)args);
  make_exception<std::filesystem::__cxx11::path,_const_char_*,_long,_const_char_*,_unsigned_long>::
  operator()(&local_39,(stringstream *)msg_00,(path *)&local_68,(char *)args_local_2,local_38,args_3
             ,args_4);
  Catch::clara::std::filesystem::__cxx11::path::~path(&local_68);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }